

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseVectorSum.h
# Opt level: O1

void __thiscall HighsSparseVectorSum::add(HighsSparseVectorSum *this,HighsInt index,double value)

{
  double dVar1;
  pointer pHVar2;
  iterator __position;
  pointer pHVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  HighsInt local_c;
  
  pHVar2 = (this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar3 = pHVar2 + index;
  dVar5 = pHVar2[index].hi;
  dVar1 = pHVar2[index].lo;
  dVar6 = dVar5 + dVar1;
  local_c = index;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar6 = dVar5 + value;
    pHVar3->hi = dVar6;
    pHVar3->lo = dVar1 + (dVar5 - (dVar6 - value)) + (value - (dVar6 - (dVar6 - value)));
  }
  else {
    pHVar3->hi = value;
    pHVar3->lo = 0.0;
    __position._M_current =
         (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->nonzeroinds,__position,&local_c);
    }
    else {
      *__position._M_current = index;
      (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  lVar4 = (long)local_c;
  pHVar3 = (this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar5 = pHVar3[lVar4].hi + pHVar3[lVar4].lo;
  if ((dVar5 == 0.0) && (!NAN(dVar5))) {
    pHVar3[lVar4].hi = 2.2250738585072014e-308;
    pHVar3[lVar4].lo = 0.0;
  }
  return;
}

Assistant:

void add(HighsInt index, double value) {
    assert(index >= 0 && index < (HighsInt)values.size());
    if (values[index] != 0.0) {
      values[index] += value;
    } else {
      values[index] = value;
      nonzeroinds.push_back(index);
    }

    if (values[index] == 0.0)
      values[index] = std::numeric_limits<double>::min();
  }